

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bipart.cpp
# Opt level: O0

Dist * Omega_h::bi_partition(Dist *__return_storage_ptr__,CommPtr *comm,Read<signed_char> *marks)

{
  int iVar1;
  I32 IVar2;
  element_type *peVar3;
  ostream *poVar4;
  long total_00;
  void *offset;
  Remotes local_308;
  shared_ptr<Omega_h::Comm> local_2e8;
  Write<int> local_2d8;
  Read<int> local_2c8;
  Write<int> local_2b8;
  Read<int> local_2a8;
  undefined1 local_298 [8];
  Remotes dests;
  Read<int> local_268;
  Read<int> local_258;
  Write<int> local_248;
  Read<int> local_238;
  Read<int> local_228;
  Read<int> local_218;
  Read<long> local_208;
  undefined1 local_1f8 [8];
  Remotes owners;
  string local_1d0 [32];
  undefined1 local_1b0 [8];
  Read<long> globals;
  long start;
  long total;
  undefined1 local_180 [8];
  LOs marked;
  Read<signed_char> local_160;
  int local_150;
  int local_14c;
  Int half;
  I32 rank_start;
  LO linsize;
  undefined1 local_120 [8];
  Write<int> dest_idxs;
  allocator local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Write<int> dest_ranks;
  int halfsize;
  Read<signed_char> *marks_local;
  CommPtr *comm_local;
  LO local_68;
  LO local_58;
  ulong local_40;
  ulong local_28;
  ulong local_10;
  
  peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)comm);
  IVar2 = Comm::size(peVar3);
  if (IVar2 % 2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ERROR: ");
    poVar4 = std::operator<<(poVar4,
                             "To use bi_partiion, please run with an even number of MPI ranks.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)comm);
  IVar2 = Comm::size(peVar3);
  if (IVar2 % 2 == 0) {
    peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    IVar2 = Comm::size(peVar3);
    dest_ranks.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>(IVar2,2);
    if (((ulong)(marks->write_).shared_alloc_.alloc & 1) == 0) {
      local_58 = (LO)((marks->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_58 = (LO)((ulong)(marks->write_).shared_alloc_.alloc >> 3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"",&local_f9);
    Write<int>::Write((Write<int> *)local_d8,local_58,(string *)local_f8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    if (((ulong)(marks->write_).shared_alloc_.alloc & 1) == 0) {
      local_68 = (LO)((marks->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_68 = (LO)((ulong)(marks->write_).shared_alloc_.alloc >> 3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&linsize,"",(allocator *)((long)&rank_start + 3));
    Write<int>::Write((Write<int> *)local_120,local_68,(string *)&linsize);
    std::__cxx11::string::~string((string *)&linsize);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rank_start + 3));
    half = -1;
    local_14c = 0;
    for (local_150 = 0; local_150 < 2; local_150 = local_150 + 1) {
      Read<signed_char>::Read((Read<signed_char> *)&marked.write_.shared_alloc_.direct_ptr,marks);
      invert_marks((Omega_h *)&local_160,
                   (Read<signed_char> *)&marked.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::operator=(marks,&local_160);
      Read<signed_char>::~Read(&local_160);
      Read<signed_char>::~Read((Read<signed_char> *)&marked.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::Read((Read<signed_char> *)&total,marks);
      collect_marked((Omega_h *)local_180,(Read<signed_char> *)&total);
      Read<signed_char>::~Read((Read<signed_char> *)&total);
      peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      if (((ulong)local_180 & 1) == 0) {
        local_40 = *(size_t *)local_180;
      }
      else {
        local_40 = (ulong)local_180 >> 3;
      }
      total_00 = Comm::allreduce<long>(peVar3,(long)(int)(local_40 >> 2),OMEGA_H_SUM);
      peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      if (((ulong)local_180 & 1) == 0) {
        local_28 = *(size_t *)local_180;
      }
      else {
        local_28 = (ulong)local_180 >> 3;
      }
      offset = (void *)Comm::exscan<long>(peVar3,(long)(int)(local_28 >> 2),OMEGA_H_SUM);
      if (((ulong)local_180 & 1) == 0) {
        local_10 = *(size_t *)local_180;
      }
      else {
        local_10 = (ulong)local_180 >> 3;
      }
      globals.write_.shared_alloc_.direct_ptr = offset;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d0,"",(allocator *)((long)&owners.idxs.write_.shared_alloc_.direct_ptr + 7))
      ;
      Read<long>::Read((Read<long> *)local_1b0,(LO)(local_10 >> 2),(long)offset,1,
                       (string *)local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&owners.idxs.write_.shared_alloc_.direct_ptr + 7));
      Read<long>::Read(&local_208,(Read<int> *)local_1b0);
      globals_to_linear_owners
                ((Remotes *)local_1f8,&local_208,total_00,dest_ranks.shared_alloc_.direct_ptr._4_4_)
      ;
      Read<long>::~Read(&local_208);
      Read<int>::Read(&local_228,(Read<int> *)local_1f8);
      add_to_each<int>((Omega_h *)&local_218,&local_228,local_14c);
      Read<int>::Read(&local_238,(Read<int> *)local_180);
      Write<int>::Write(&local_248,(Write<int> *)local_d8);
      map_into<int>(&local_218,&local_238,&local_248,1);
      Write<int>::~Write(&local_248);
      Read<int>::~Read(&local_238);
      Read<int>::~Read(&local_218);
      Read<int>::~Read(&local_228);
      Read<int>::Read(&local_258,(Read<int> *)&owners.ranks.write_.shared_alloc_.direct_ptr);
      Read<int>::Read(&local_268,(Read<int> *)local_180);
      Write<int>::Write((Write<int> *)&dests.idxs.write_.shared_alloc_.direct_ptr,
                        (Write<int> *)local_120);
      map_into<int>(&local_258,&local_268,(Write<int> *)&dests.idxs.write_.shared_alloc_.direct_ptr,
                    1);
      Write<int>::~Write((Write<int> *)&dests.idxs.write_.shared_alloc_.direct_ptr);
      Read<int>::~Read(&local_268);
      Read<int>::~Read(&local_258);
      iVar1 = local_14c;
      peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      IVar2 = Comm::rank(peVar3);
      if (iVar1 <= IVar2) {
        peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)comm);
        IVar2 = Comm::rank(peVar3);
        iVar1 = dest_ranks.shared_alloc_.direct_ptr._4_4_;
        if (IVar2 < local_14c + dest_ranks.shared_alloc_.direct_ptr._4_4_) {
          peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)comm);
          IVar2 = Comm::rank(peVar3);
          half = linear_partition_size(total_00,iVar1,IVar2 - local_14c);
        }
      }
      local_14c = dest_ranks.shared_alloc_.direct_ptr._4_4_ + local_14c;
      Remotes::~Remotes((Remotes *)local_1f8);
      Read<long>::~Read((Read<long> *)local_1b0);
      Read<int>::~Read((Read<int> *)local_180);
    }
    Write<int>::Write(&local_2b8,(Write<int> *)local_d8);
    Read<int>::Read(&local_2a8,&local_2b8);
    Write<int>::Write(&local_2d8,(Write<int> *)local_120);
    Read<int>::Read(&local_2c8,&local_2d8);
    Remotes::Remotes((Remotes *)local_298,&local_2a8,&local_2c8);
    Read<int>::~Read(&local_2c8);
    Write<int>::~Write(&local_2d8);
    Read<int>::~Read(&local_2a8);
    Write<int>::~Write(&local_2b8);
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_2e8,comm);
    Remotes::Remotes(&local_308,(Remotes *)local_298);
    Dist::Dist(__return_storage_ptr__,&local_2e8,&local_308,half);
    Remotes::~Remotes(&local_308);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_2e8);
    Remotes::~Remotes((Remotes *)local_298);
    Write<int>::~Write((Write<int> *)local_120);
    Write<int>::~Write((Write<int> *)local_d8);
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","comm->size() % 2 == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_bipart.cpp"
       ,10);
}

Assistant:

Dist bi_partition(CommPtr comm, Read<I8> marks) {
  OMEGA_H_CHECK_MSG(comm->size() % 2 == 0, "To use bi_partiion, please run with an even number of MPI ranks.");
  auto halfsize = divide_no_remainder(comm->size(), 2);
  Write<I32> dest_ranks(marks.size());
  Write<LO> dest_idxs(marks.size());
  LO linsize = -1;
  I32 rank_start = 0;
  for (Int half = 0; half < 2; ++half) {
    marks = invert_marks(marks);
    auto marked = collect_marked(marks);
    auto total = comm->allreduce(GO(marked.size()), OMEGA_H_SUM);
    auto start = comm->exscan(GO(marked.size()), OMEGA_H_SUM);
    Read<GO> globals(marked.size(), start, 1);
    auto owners = globals_to_linear_owners(globals, total, halfsize);
    map_into(add_to_each(owners.ranks, rank_start), marked, dest_ranks, 1);
    map_into(owners.idxs, marked, dest_idxs, 1);
    if (rank_start <= comm->rank() && comm->rank() < (rank_start + halfsize)) {
      linsize =
          linear_partition_size(total, halfsize, comm->rank() - rank_start);
    }
    rank_start += halfsize;
  }
  auto dests = Remotes(Read<I32>(dest_ranks), Read<LO>(dest_idxs));
  return Dist(comm, dests, linsize);
}